

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

VarConcat * __thiscall kratos::Var::concat(Var *this,Var *var)

{
  VarConcat *pVVar1;
  pointer ppVVar2;
  shared_ptr<kratos::VarConcat> *exist_var;
  pointer psVar3;
  shared_ptr<kratos::Var> local_58;
  shared_ptr<kratos::Var> local_48;
  undefined1 local_38 [8];
  shared_ptr<kratos::VarConcat> concat_ptr;
  
  psVar3 = (this->concat_vars_).
           super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (psVar3 == (this->concat_vars_).
                  super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<kratos::Var>);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &var->super_enable_shared_from_this<kratos::Var>);
      std::__shared_ptr<kratos::VarConcat,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<kratos::VarConcat>,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>>
                ((__shared_ptr<kratos::VarConcat,(__gnu_cxx::_Lock_policy)2> *)local_38,
                 (allocator<kratos::VarConcat> *)
                 ((long)&concat_ptr.
                         super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7),&local_58,&local_48);
      if (local_48.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_58.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      std::
      vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
      ::emplace_back<std::shared_ptr<kratos::VarConcat>&>
                ((vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
                  *)&this->concat_vars_,(shared_ptr<kratos::VarConcat> *)local_38);
      if (concat_ptr.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   concat_ptr.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      return (VarConcat *)local_38;
    }
    pVVar1 = (psVar3->super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppVVar2 = (pVVar1->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (((long)ppVVar2 -
         (long)(pVVar1->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
               _M_impl.super__Vector_impl_data._M_start == 0x10) && (ppVVar2[-1] == var)) break;
    psVar3 = psVar3 + 1;
  }
  return pVVar1;
}

Assistant:

VarConcat &Var::concat(Var &var) {
    auto *ptr = &var;
    // notice that we effectively created an implicit sink->sink by creating a concat
    // however, it's not an assignment, that's why we need to use concat_vars to hold the
    // vars
    for (auto const &exist_var : concat_vars_) {
        // reuse the existing variables
        if (exist_var->vars().size() == 2 && exist_var->vars().back() == ptr) {
            return *exist_var;
        }
    }
    auto concat_ptr = std::make_shared<VarConcat>(shared_from_this(), ptr->shared_from_this());
    concat_vars_.emplace_back(concat_ptr);
    return *concat_ptr;
}